

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

MemoryProfiler * MemoryProfiler::EnsureMemoryProfiler(void)

{
  NoCheckHeapAllocator *alloc;
  MemoryProfiler *pMVar1;
  undefined8 *in_FS_OFFSET;
  AutoCriticalSection local_70;
  AutoCriticalSection autocs;
  TrackAllocData local_38;
  MemoryProfiler *local_10;
  MemoryProfiler *memoryProfiler;
  
  local_10 = *(MemoryProfiler **)*in_FS_OFFSET;
  if (local_10 == (MemoryProfiler *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
               ,0x31);
    alloc = Memory::NoCheckHeapAllocator::TrackAllocInfo
                      ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_38);
    pMVar1 = (MemoryProfiler *)new<Memory::NoCheckHeapAllocator>(0x428,alloc,0x25f760);
    MemoryProfiler(pMVar1);
    local_10 = pMVar1;
    AutoCriticalSection::AutoCriticalSection(&local_70,&s_cs);
    pMVar1 = BasePtr<MemoryProfiler>::Detach(&profilers.super_BasePtr<MemoryProfiler>);
    local_10->next = pMVar1;
    AutoPtr<MemoryProfiler,_Memory::NoCheckHeapAllocator>::operator=(&profilers,local_10);
    AutoCriticalSection::~AutoCriticalSection(&local_70);
    *(MemoryProfiler **)*in_FS_OFFSET = local_10;
  }
  return local_10;
}

Assistant:

MemoryProfiler *
MemoryProfiler::EnsureMemoryProfiler()
{
    MemoryProfiler * memoryProfiler = MemoryProfiler::Instance;

    if (memoryProfiler == nullptr)
    {
        memoryProfiler = NoCheckHeapNew(MemoryProfiler);

        {
            AutoCriticalSection autocs(&s_cs);
            memoryProfiler->next = MemoryProfiler::profilers.Detach();
            MemoryProfiler::profilers = memoryProfiler;
        }

        MemoryProfiler::Instance = memoryProfiler;
    }
    return memoryProfiler;
}